

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

int verifyPath(DirHandle *h,char **_fname,int allowMissing)

{
  ulong __n;
  char cVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  PHYSFS_ErrorCode PVar5;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  bool bVar10;
  PHYSFS_Stat statbuf;
  
  pcVar8 = *_fname;
  if ((*pcVar8 == '\0') && (h->root == (char *)0x0)) {
    return 1;
  }
  pcVar9 = h->mountPoint;
  if (pcVar9 != (char *)0x0) {
    sVar6 = strlen(pcVar9);
    sVar7 = strlen(pcVar8);
    if (sVar6 < 2) {
      __assert_fail("mntpntlen > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/jarikomppa[P]physfs_magicstream/src/physfs.c"
                    ,0x82c,"int verifyPath(DirHandle *, char **, int)");
    }
    __n = sVar6 - 1;
    if ((sVar7 < __n) || (iVar3 = strncmp(pcVar9,pcVar8,__n), iVar3 != 0)) {
LAB_00108b73:
      PVar5 = PHYSFS_ERR_NOT_FOUND;
      goto LAB_00108b75;
    }
    if (__n < sVar7) {
      if (pcVar8[__n] != '/') goto LAB_00108b73;
    }
    else if (pcVar8[__n] != '/') {
      sVar6 = __n;
    }
    pcVar8 = pcVar8 + sVar6;
    *_fname = pcVar8;
  }
  pcVar9 = pcVar8;
  if (h->root != (char *)0x0) {
    cVar1 = *pcVar8;
    sVar2 = h->rootlen;
    pcVar9 = pcVar8 + (1 - sVar2);
    strcpy(pcVar9,h->root);
    if (cVar1 != '\0') {
      pcVar8[h->rootlen + (-1 - sVar2)] = '/';
    }
    *_fname = pcVar9;
  }
  if (allowSymLinks != 0) {
    return 1;
  }
  iVar3 = 1;
  pcVar8 = pcVar9;
  while( true ) {
    pcVar8 = strchr(pcVar8,0x2f);
    if (pcVar8 != (char *)0x0) {
      *pcVar8 = '\0';
    }
    iVar4 = (*h->funcs->stat)(h->opaque,pcVar9,&statbuf);
    if (iVar4 == 0) {
      PVar5 = currentErrorCode();
      if (PVar5 == PHYSFS_ERR_NOT_FOUND) {
        iVar3 = 0;
      }
      bVar10 = true;
    }
    else {
      bVar10 = statbuf.filetype != PHYSFS_FILETYPE_SYMLINK;
    }
    if (pcVar8 != (char *)0x0) {
      *pcVar8 = '/';
    }
    if (!bVar10) break;
    if (iVar3 == 0) {
      return (uint)(allowMissing != 0 || pcVar8 == (char *)0x0);
    }
    if (pcVar8 == (char *)0x0) {
      return iVar3;
    }
    pcVar8 = pcVar8 + 1;
  }
  PVar5 = PHYSFS_ERR_SYMLINK_FORBIDDEN;
LAB_00108b75:
  PHYSFS_setErrorCode(PVar5);
  return 0;
}

Assistant:

static int verifyPath(DirHandle *h, char **_fname, int allowMissing)
{
    char *fname = *_fname;
    int retval = 1;
    char *start;
    char *end;

    if ((*fname == '\0') && (!h->root))  /* quick rejection. */
        return 1;

    /* !!! FIXME: This codeblock sucks. */
    if (h->mountPoint != NULL)  /* NULL mountpoint means "/". */
    {
        size_t mntpntlen = strlen(h->mountPoint);
        size_t len = strlen(fname);
        assert(mntpntlen > 1); /* root mount points should be NULL. */
        /* not under the mountpoint, so skip this archive. */
        BAIL_IF(len < mntpntlen-1, PHYSFS_ERR_NOT_FOUND, 0);
        /* !!! FIXME: Case insensitive? */
        retval = strncmp(h->mountPoint, fname, mntpntlen-1);
        BAIL_IF(retval != 0, PHYSFS_ERR_NOT_FOUND, 0);
        if (len > mntpntlen-1)  /* corner case... */
            BAIL_IF(fname[mntpntlen-1]!='/', PHYSFS_ERR_NOT_FOUND, 0);
        fname += mntpntlen-1;  /* move to start of actual archive path. */
        if (*fname == '/')
            fname++;
        *_fname = fname;  /* skip mountpoint for later use. */
        retval = 1;  /* may be reset, below. */
    } /* if */

    /* prepend the root directory, if any. */
    if (h->root)
    {
        const int isempty = (*fname == '\0');
        fname -= h->rootlen - 1;
        strcpy(fname, h->root);
        if (!isempty)
            fname[h->rootlen - 2] = '/';
        *_fname = fname;
    } /* if */

    start = fname;
    if (!allowSymLinks)
    {
        while (1)
        {
            PHYSFS_Stat statbuf;
            int rc = 0;
            end = strchr(start, '/');

            if (end != NULL) *end = '\0';
            rc = h->funcs->stat(h->opaque, fname, &statbuf);
            if (rc)
                rc = (statbuf.filetype == PHYSFS_FILETYPE_SYMLINK);
            else if (currentErrorCode() == PHYSFS_ERR_NOT_FOUND)
                retval = 0;

            if (end != NULL) *end = '/';

            /* insecure path (has a disallowed symlink in it)? */
            BAIL_IF(rc, PHYSFS_ERR_SYMLINK_FORBIDDEN, 0);

            /* break out early if path element is missing. */
            if (!retval)
            {
                /*
                 * We need to clear it if it's the last element of the path,
                 *  since this might be a non-existant file we're opening
                 *  for writing...
                 */
                if ((end == NULL) || (allowMissing))
                    retval = 1;
                break;
            } /* if */

            if (end == NULL)
                break;

            start = end + 1;
        } /* while */
    } /* if */

    return retval;
}